

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

void tnt_request_free(tnt_request *req)

{
  tnt_request *req_local;
  
  if (req->key_object != (tnt_stream *)0x0) {
    tnt_stream_free(req->key_object);
  }
  req->key_object = (tnt_stream *)0x0;
  if (req->tuple_object != (tnt_stream *)0x0) {
    tnt_stream_free(req->tuple_object);
  }
  req->tuple_object = (tnt_stream *)0x0;
  if (req->alloc != 0) {
    tnt_mem_free(req);
  }
  return;
}

Assistant:

void tnt_request_free(struct tnt_request *req) {
	if (req->key_object)
		tnt_stream_free(req->key_object);
	req->key_object = NULL;
	if (req->tuple_object)
		tnt_stream_free(req->tuple_object);
	req->tuple_object = NULL;
	if (req->alloc) tnt_mem_free(req);
}